

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Attribute_PDU::Attribute_PDU
          (Attribute_PDU *this,SimulationIdentifier *OriginatingID,PDUType T,ProtocolVersion PV,
          AttributeID MART,ActionCode AC)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Attribute_PDU_002210f8;
  (this->m_OrigSimAddr).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar1 = OriginatingID->m_ui16ApplicationID;
  (this->m_OrigSimAddr).m_ui16SiteID = OriginatingID->m_ui16SiteID;
  (this->m_OrigSimAddr).m_ui16ApplicationID = KVar1;
  this->m_ui32Padding = 0;
  this->m_ui16Padding = 0;
  this->m_ui8ExtPDUType = (KUINT8)T;
  this->m_ui8ExtProtocolVersion = (KUINT8)PV;
  this->m_ui32MasterRecType = MART;
  this->m_ui8ActionCode = (KUINT8)AC;
  *(undefined8 *)&this->m_ui8Padding1 = 0;
  *(undefined8 *)
   ((long)&(this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start + 5) = 0;
  (this->m_vAttributeRecordSets).
  super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAttributeRecordSets).
  super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = 'H';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

Attribute_PDU::Attribute_PDU( const SimulationIdentifier & OriginatingID, PDUType T, 
                              ProtocolVersion PV, AttributeID MART, ActionCode AC ) :
    m_OrigSimAddr( OriginatingID ),
    m_ui32Padding( 0 ),
    m_ui16Padding( 0 ),
    m_ui8ExtPDUType( T ),
    m_ui8ExtProtocolVersion( PV ),
    m_ui32MasterRecType( MART ),
    m_ui8Padding1( 0 ),
    m_ui8ActionCode( AC ),
    m_ui16NumAttrRecSets( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Attribute_PDU_Type;
    m_ui16PDULength = ATTRIBUTE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
}